

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

void __thiscall adios2::core::IO::EnterComputationBlock(IO *this)

{
  Mode MVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_Engines)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    MVar1 = Engine::OpenMode(*(Engine **)(p_Var2 + 2));
    if (MVar1 != Read) {
      (**(code **)(**(long **)(p_Var2 + 2) + 0x98))();
    }
  }
  return;
}

Assistant:

void IO::EnterComputationBlock() noexcept
{
    for (auto &enginePair : m_Engines)
    {
        auto &engine = enginePair.second;
        if (engine->OpenMode() != Mode::Read)
        {
            enginePair.second->EnterComputationBlock();
        }
    }
}